

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int buffer_encrypt_record(ptls_buffer_t *buf,size_t rec_start,ptls_aead_context_t *aead)

{
  int iVar1;
  size_t inlen;
  ushort local_412a;
  size_t enclen;
  undefined2 local_411b;
  undefined1 local_4119;
  uint8_t encrypted [16640];
  
  inlen = (buf->off - rec_start) - 5;
  if (inlen < 0x4001) {
    iVar1 = ptls_aead_transform(aead,encrypted,&enclen,buf->base + rec_start + 5,inlen,
                                buf->base[rec_start]);
    if (iVar1 == 0) {
      buf->off = rec_start;
      local_411b = 0x317;
      local_4119 = 1;
      iVar1 = ptls_buffer__do_pushv(buf,&local_411b,3);
      if (iVar1 == 0) {
        local_412a = (ushort)enclen << 8 | (ushort)enclen >> 8;
        iVar1 = ptls_buffer__do_pushv(buf,&local_412a,2);
        if (iVar1 == 0) {
          iVar1 = ptls_buffer__do_pushv(buf,encrypted,CONCAT62(enclen._2_6_,(ushort)enclen));
        }
      }
    }
    return iVar1;
  }
  __assert_fail("bodylen <= PTLS_MAX_PLAINTEXT_RECORD_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                ,0x15b,"int buffer_encrypt_record(ptls_buffer_t *, size_t, ptls_aead_context_t *)");
}

Assistant:

static int buffer_encrypt_record(ptls_buffer_t *buf, size_t rec_start, ptls_aead_context_t *aead)
{
    uint8_t encrypted[PTLS_MAX_ENCRYPTED_RECORD_SIZE];
    size_t enclen, bodylen = buf->off - rec_start - 5;
    int ret;

    assert(bodylen <= PTLS_MAX_PLAINTEXT_RECORD_SIZE);

    if ((ret = ptls_aead_transform(aead, encrypted, &enclen, buf->base + rec_start + 5, bodylen, buf->base[rec_start])) != 0)
        goto Exit;
    buf->off = rec_start;
    ptls_buffer_push(buf, PTLS_CONTENT_TYPE_APPDATA, 3, 1);
    ptls_buffer_push16(buf, enclen);
    ptls_buffer_pushv(buf, encrypted, enclen);

Exit:
    return ret;
}